

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void ConnectSolution(int64_t cindex,TPZCompMesh *cmesh,TPZFMatrix<double> *glob,TPZVec<double> *sol)

{
  long lVar1;
  int iVar2;
  TNode *pTVar3;
  TPZConnect *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(cmesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,cindex);
  iVar2 = (int)pTVar4->fSequenceNumber;
  pTVar3 = (cmesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
  lVar7 = (long)pTVar3[iVar2].dim;
  lVar6 = (long)pTVar3[iVar2].pos;
  (*sol->_vptr_TPZVec[4])(sol,lVar7);
  if (0 < lVar7) {
    lVar5 = 0;
    do {
      if (((lVar6 + lVar5 < 0) ||
          ((glob->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6 + lVar5)) ||
         ((glob->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      sol->fStore[lVar5] = glob->fElem[lVar6 + lVar5];
      lVar1 = lVar6 + lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar1 + 1 < lVar7 + lVar6);
  }
  return;
}

Assistant:

static void ConnectSolution(int64_t cindex, TPZCompMesh *cmesh, TPZFMatrix<STATE> &glob, TPZVec<STATE> &sol)
{
    int64_t seqnum = cmesh->ConnectVec()[cindex].SequenceNumber();
    int blsize = cmesh->Block().Size(seqnum);
    int position = cmesh->Block().Position(seqnum);
    sol.resize(blsize);
    for (int64_t i=position; i< position+blsize; i++) {
        sol[i-position] = glob(i,0);
    }
}